

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

void __thiscall BigInteger::_divide(BigInteger *this,int a,int *remainder)

{
  pointer puVar1;
  ulong uVar2;
  zero_division_error *this_00;
  ulong uVar3;
  ulong uVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __tmp
  ;
  pointer puVar5;
  
  uVar4 = (ulong)(uint)a;
  if (a == 0) {
    this_00 = (zero_division_error *)__cxa_allocate_exception(0x10);
    zero_division_error::runtime_error(this_00,"Integer division by zero");
    __cxa_throw(this_00,&zero_division_error::typeinfo,std::runtime_error::~runtime_error);
  }
  puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar1 != puVar5) {
    if (a < 0) {
      this->negative = (bool)(this->negative ^ 1);
      uVar4 = (ulong)(uint)-a;
    }
    uVar3 = 0;
    for (; puVar5 != puVar1; puVar5 = puVar5 + -1) {
      uVar2 = (ulong)puVar5[-1] + uVar3 * 1000000000;
      uVar3 = uVar2 % uVar4;
      puVar5[-1] = (uint)(uVar2 / uVar4);
    }
    *remainder = (int)uVar3;
    normalize(this);
    return;
  }
  *remainder = 0;
  return;
}

Assistant:

void BigInteger::_divide(int a, int &remainder)
{
    if(!a)
        throw zero_division_error("Integer division by zero");
    if(digits.empty())
    {
        remainder = 0;
        return;
    }
    if(a < 0)
    {
        negative ^= 1;
        a = -a;
    }
    long long carry = 0;
    for(auto i = digits.rbegin(); i != digits.rend(); ++i)
    {
        carry = carry * BLOCK_MOD + *i;
        *i = carry / a;
        carry %= a;
    }
    remainder = static_cast<int>(carry);
    normalize();
}